

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

void hdr_iter_linear_init(hdr_iter *iter,hdr_histogram *h,int64_t value_units_per_bucket)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  
  iter->h = h;
  iter->counts_index = -1;
  iter->total_count = h->total_count;
  iter->count = 0;
  iter->cumulative_count = 0;
  iter->value = 0;
  iter->highest_equivalent_value = 0;
  iter->value_iterated_from = 0;
  iter->value_iterated_to = 0;
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  (iter->specifics).linear.value_units_per_bucket = value_units_per_bucket;
  (iter->specifics).linear.next_value_reporting_level = value_units_per_bucket;
  uVar2 = h->sub_bucket_mask | value_units_per_bucket;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  bVar3 = 0x3f - (((byte)lVar1 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
  (iter->specifics).linear.next_value_reporting_level_lowest_equivalent =
       (long)(int)(value_units_per_bucket >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
  iter->_next_fp = iter_linear_next;
  return;
}

Assistant:

void hdr_iter_linear_init(struct hdr_iter* iter, const struct hdr_histogram* h, int64_t value_units_per_bucket)
{
    hdr_iter_init(iter, h);

    iter->specifics.linear.count_added_in_this_iteration_step = 0;
    iter->specifics.linear.value_units_per_bucket = value_units_per_bucket;
    iter->specifics.linear.next_value_reporting_level = value_units_per_bucket;
    iter->specifics.linear.next_value_reporting_level_lowest_equivalent = lowest_equivalent_value(h, value_units_per_bucket);

    iter->_next_fp = iter_linear_next;
}